

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_defer_clear_queue(void)

{
  fio_defer_clear_tasks();
  return;
}

Assistant:

void fio_defer_clear_queue(void) { fio_defer_clear_tasks(); }